

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_jumps.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5dbd0::ir_lower_jumps_visitor::visit
          (ir_lower_jumps_visitor *this,ir_loop_jump *ir)

{
  exec_node *ir_00;
  
  ir_00 = &(ir->super_ir_jump).super_ir_instruction.super_exec_node;
  if (ir == (ir_loop_jump *)0x0) {
    ir_00 = (exec_node *)0x0;
  }
  truncate_after_instruction(this,ir_00);
  (this->block).min_strength =
       (*(int *)&(ir->super_ir_jump).super_ir_instruction.field_0x1c == 0) + strength_continue;
  return;
}

Assistant:

virtual void visit(class ir_loop_jump * ir)
   {
      /* Eliminate all instructions after each one, since they are
       * unreachable.  This satisfies the DEAD_CODE_ELIMINATION
       * postcondition.
       */
      truncate_after_instruction(ir);

      /* Set this->block.min_strength based on this instruction.  This
       * satisfies the ANALYSIS postcondition.  It is not necessary to
       * update this->block.may_clear_execute_flag or
       * this->loop.may_set_return_flag, because an unlowered jump
       * instruction can't change any flags.
       */
      this->block.min_strength = ir->is_break() ? strength_break : strength_continue;

      /* The CONTAINED_JUMPS_LOWERED postcondition is already
       * satisfied, because jump statements can't contain other
       * statements.
       */
   }